

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest05VerifyingPathswithSelfIssuedCertificates_::
Section5InvalidBasicSelfIssuedNewWithOldTest5<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::~Section5InvalidBasicSelfIssuedNewWithOldTest5
          (Section5InvalidBasicSelfIssuedNewWithOldTest5<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest05VerifyingPathswithSelfIssuedCertificates,
                     Section5InvalidBasicSelfIssuedNewWithOldTest5) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "BasicSelfIssuedOldKeyCACert",
                               "BasicSelfIssuedOldKeyNewWithOldCACert",
                               "InvalidBasicSelfIssuedNewWithOldTest5EE"};
  const char* const crls[] = {"TrustAnchorRootCRL",
                              "BasicSelfIssuedOldKeySelfIssuedCertCRL",
                              "BasicSelfIssuedOldKeyCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.5.5";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}